

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall hdc::Driver::setFlags(Driver *this,int argc,char **argv)

{
  char *__s1;
  int iVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  allocator local_79;
  string *local_78;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_70;
  Logger *local_68;
  string *local_60;
  Driver *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_60 = (string *)&this->mainFilePath;
  local_78 = &this->outputName;
  local_70 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->searchPath;
  local_68 = &this->logger;
  iVar4 = 1;
  local_58 = this;
  do {
    if (argc <= iVar4) {
      return;
    }
    __s1 = argv[iVar4];
    iVar1 = strcmp(__s1,"-cpp");
    if (iVar1 == 0) {
      local_58->emitCppFlag = true;
    }
    else {
      iVar1 = strcmp(__s1,"-log");
      if (iVar1 == 0) {
        iVar3 = iVar4 + 1;
        iVar1 = strcmp(argv[(long)iVar4 + 1],"all");
        iVar4 = iVar3;
        if (iVar1 == 0) {
          Logger::setAllFlags(local_68);
        }
      }
      else {
        if (*__s1 == '-') {
          if ((__s1[1] != 'i') || (__s1[2] != '\0')) {
            if ((__s1[1] == 'o') && (__s1[2] == '\0')) {
              std::__cxx11::string::assign((char *)local_78);
              iVar4 = iVar4 + 1;
              goto LAB_00174443;
            }
            goto LAB_0017439c;
          }
          std::__cxx11::string::string((string *)&local_50,argv[(long)iVar4 + 1],&local_79);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_70,&local_50);
          iVar4 = iVar4 + 1;
        }
        else {
LAB_0017439c:
          pcVar2 = strstr(__s1,".hd");
          if (pcVar2 == (char *)0x0) goto LAB_00174443;
          std::__cxx11::string::string((string *)&local_50,__s1,&local_79);
          std::__cxx11::string::operator=(local_60,(string *)&local_50);
        }
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
LAB_00174443:
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void Driver::setFlags(int argc, char* argv[]) {
    for (int i = 1; i < argc; ++i) {
        if (strcmp(argv[i], "-cpp") == 0) {
            emitCppFlag = true;
        } else if (strcmp(argv[i], "-log") == 0) {
            ++i;

            if (strcmp(argv[i], "all") == 0) {
                logger.setAllFlags();
            }
        } else if (strcmp(argv[i], "-i") == 0) {
            ++i;

            searchPath.push_back(argv[i]);
        } else if (strcmp(argv[i], "-o") == 0) {
            ++i;

            outputName = argv[i];
        } else if (strstr(argv[i], ".hd") != nullptr) {
            mainFilePath = std::string(argv[i]);
        }
    }
}